

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.h
# Opt level: O0

uint64_t bswap64(uint64_t v)

{
  uint64_t v_local;
  
  return v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
         (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
         (v & 0xff00) << 0x28 | v << 0x38;
}

Assistant:

static inline uint64_t bswap64(uint64_t v)
{
    return ((v & ((uint64_t)0xff << (7 * 8))) >> (7 * 8)) | 
        ((v & ((uint64_t)0xff << (6 * 8))) >> (5 * 8)) | 
        ((v & ((uint64_t)0xff << (5 * 8))) >> (3 * 8)) | 
        ((v & ((uint64_t)0xff << (4 * 8))) >> (1 * 8)) | 
        ((v & ((uint64_t)0xff << (3 * 8))) << (1 * 8)) | 
        ((v & ((uint64_t)0xff << (2 * 8))) << (3 * 8)) | 
        ((v & ((uint64_t)0xff << (1 * 8))) << (5 * 8)) | 
        ((v & ((uint64_t)0xff << (0 * 8))) << (7 * 8));
}